

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

int uv_thread_create(uv_thread_t *tid,_func_void_void_ptr *entry,void *arg)

{
  int iVar1;
  undefined8 *__arg;
  
  __arg = (undefined8 *)malloc(0x10);
  if (__arg == (undefined8 *)0x0) {
    iVar1 = -0xc;
  }
  else {
    *__arg = entry;
    __arg[1] = arg;
    iVar1 = pthread_create(tid,(pthread_attr_t *)0x0,uv__thread_start,__arg);
    if (iVar1 != 0) {
      free(__arg);
    }
    iVar1 = -(uint)(iVar1 != 0);
  }
  return iVar1;
}

Assistant:

int uv_thread_create(uv_thread_t *tid, void (*entry)(void *arg), void *arg) {
  struct thread_ctx* ctx;
  int err;

  ctx = malloc(sizeof(*ctx));
  if (ctx == NULL)
    return UV_ENOMEM;

  ctx->entry = entry;
  ctx->arg = arg;

#ifdef _WIN32
  *tid = (HANDLE) _beginthreadex(NULL, 0, uv__thread_start, ctx, 0, NULL);
  err = *tid ? 0 : errno;
#else
  err = pthread_create(tid, NULL, uv__thread_start, ctx);
#endif

  if (err)
    free(ctx);

  return err ? -1 : 0;
}